

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_thread_sem.cc
# Opt level: O0

void absl::synchronization_internal::PerThreadSem::Tick(ThreadIdentity *identity)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  atomic<int> *paVar4;
  Waiter *this;
  bool is_idle;
  int wait_start;
  int ticker;
  ThreadIdentity *identity_local;
  memory_order __b;
  
  paVar4 = &identity->ticker;
  LOCK();
  iVar1 = (paVar4->super___atomic_base<int>)._M_i;
  (paVar4->super___atomic_base<int>)._M_i = (paVar4->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  std::operator&(memory_order_relaxed,__memory_order_mask);
  iVar2 = (identity->wait_start).super___atomic_base<int>._M_i;
  bVar3 = std::atomic<bool>::load(&identity->is_idle,memory_order_relaxed);
  if (((iVar2 != 0) && (0x3c < (iVar1 + 1) - iVar2)) && (!bVar3)) {
    this = Waiter::GetWaiter(identity);
    Waiter::Poke(this);
  }
  return;
}

Assistant:

void PerThreadSem::Tick(base_internal::ThreadIdentity *identity) {
  const int ticker =
      identity->ticker.fetch_add(1, std::memory_order_relaxed) + 1;
  const int wait_start = identity->wait_start.load(std::memory_order_relaxed);
  const bool is_idle = identity->is_idle.load(std::memory_order_relaxed);
  if (wait_start && (ticker - wait_start > Waiter::kIdlePeriods) && !is_idle) {
    // Wakeup the waiting thread since it is time for it to become idle.
    Waiter::GetWaiter(identity)->Poke();
  }
}